

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

uint32_t address_space_ldl_internal_m68k
                   (uc_struct_conflict3 *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result,device_endian endian)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  uint *puVar2;
  uint64_t val;
  hwaddr addr1;
  hwaddr l;
  uint local_40 [2];
  ram_addr_t local_38;
  hwaddr local_30;
  
  local_30 = 4;
  mr = address_space_translate(as,addr,&local_38,&local_30,false,attrs);
  if ((local_30 < 4) || (mr->ram == false)) {
    MVar1 = memory_region_dispatch_read_m68k
                      (uc,mr,local_38,(uint64_t *)local_40,
                       (uint)(endian != DEVICE_LITTLE_ENDIAN) * 8 + MO_32,attrs);
  }
  else {
    puVar2 = (uint *)qemu_map_ram_ptr_m68k((uc_struct_conflict3 *)mr->uc,mr->ram_block,local_38);
    local_40[0] = *puVar2;
    if ((endian == DEVICE_BIG_ENDIAN) || (endian != DEVICE_LITTLE_ENDIAN)) {
      local_40[0] = local_40[0] >> 0x18 | (local_40[0] & 0xff0000) >> 8 |
                    (local_40[0] & 0xff00) << 8 | local_40[0] << 0x18;
    }
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return local_40[0];
}

Assistant:

static inline uint32_t glue(address_space_ldl_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result,
    enum device_endian endian)
{
    uint8_t *ptr;
    uint64_t val;
    MemoryRegion *mr;
    hwaddr l = 4;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, false, attrs);
    if (l < 4 || !memory_access_is_direct(mr, false)) {
        release_lock |= prepare_mmio_access(mr);

        /* I/O case */
        r = memory_region_dispatch_read(uc, mr, addr1, &val,
                                        MO_32 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            val = ldl_le_p(ptr);
            break;
        case DEVICE_BIG_ENDIAN:
            val = ldl_be_p(ptr);
            break;
        default:
            val = ldl_p(ptr);
            break;
        }
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
    return val;
}